

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O2

double sptk::world::anon_unknown_5::SelectBestF0
                 (double reference_f0,double *f0_candidates,int number_of_candidates,
                 double allowed_range,double *best_error)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  *best_error = allowed_range;
  uVar2 = 0;
  uVar3 = (ulong)(uint)number_of_candidates;
  if (number_of_candidates < 1) {
    uVar3 = uVar2;
  }
  dVar4 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar1 = f0_candidates[uVar2];
    dVar5 = ABS(reference_f0 - dVar1) / reference_f0;
    if (dVar5 <= allowed_range) {
      *best_error = dVar5;
      allowed_range = dVar5;
      dVar4 = dVar1;
    }
  }
  return dVar4;
}

Assistant:

static double SelectBestF0(double reference_f0, const double *f0_candidates,
    int number_of_candidates, double allowed_range, double *best_error) {
  double best_f0 = 0.0;
  *best_error = allowed_range;

  double tmp;
  for (int i = 0; i < number_of_candidates; ++i) {
    tmp = fabs(reference_f0 - f0_candidates[i]) / reference_f0;
    if (tmp > *best_error) continue;
    best_f0 = f0_candidates[i];
    *best_error = tmp;
  }

  return best_f0;
}